

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

int __thiscall
de::BlockBuffer<unsigned_char>::tryRead
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements)

{
  bool bVar1;
  int iVar2;
  BufferCanceledException *this_00;
  int ret;
  int local_2c;
  int numRead;
  uchar *elements_local;
  int numElements_local;
  BlockBuffer<unsigned_char> *this_local;
  
  local_2c = 0;
  if (this->m_canceled == 0) {
    bVar1 = Mutex::tryLock(&this->m_readLock);
    if (bVar1) {
      while ((local_2c < numElements &&
             (iVar2 = readFromCurrentBlock(this,numElements - local_2c,elements + local_2c,false),
             iVar2 != 0))) {
        local_2c = iVar2 + local_2c;
      }
      Mutex::unlock(&this->m_readLock);
      this_local._4_4_ = local_2c;
    }
    else {
      this_local._4_4_ = 0;
    }
    return this_local._4_4_;
  }
  this_00 = (BufferCanceledException *)__cxa_allocate_exception(8);
  BufferCanceledException::BufferCanceledException(this_00);
  __cxa_throw(this_00,&BufferCanceledException::typeinfo,
              BufferCanceledException::~BufferCanceledException);
}

Assistant:

int BlockBuffer<T>::tryRead (int numElements, T* elements)
{
	int numRead = 0;

	if (m_canceled)
		throw CanceledException();

	if (!m_readLock.tryLock())
		return numRead;

	while (numRead < numElements)
	{
		int ret = readFromCurrentBlock(numElements-numRead, &elements[numRead], false /* non-blocking */);

		if (ret == 0)
			break; /* Failed. */

		numRead += ret;
	}

	m_readLock.unlock();

	return numRead;
}